

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O3

SparseTextureFormatInfo * __thiscall
Diligent::RenderDeviceGLImpl::GetSparseTextureFormatInfo
          (SparseTextureFormatInfo *__return_storage_ptr__,RenderDeviceGLImpl *this,
          TEXTURE_FORMAT TexFormat,RESOURCE_DIMENSION Dimension,Uint32 SampleCount)

{
  string msg;
  string local_30;
  
  FormatString<char[54]>
            (&local_30,(char (*) [54])"GetSparseTextureFormatInfo is not supported in OpenGL");
  DebugAssertionFailed
            (local_30._M_dataplus._M_p,"GetSparseTextureFormatInfo",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x296);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__->BindFlags = BIND_NONE;
  __return_storage_ptr__->TileSize[0] = 0;
  __return_storage_ptr__->TileSize[1] = 0;
  __return_storage_ptr__->TileSize[2] = 0;
  __return_storage_ptr__->Flags = SPARSE_TEXTURE_FLAG_NONE;
  return __return_storage_ptr__;
}

Assistant:

SparseTextureFormatInfo RenderDeviceGLImpl::GetSparseTextureFormatInfo(TEXTURE_FORMAT     TexFormat,
                                                                       RESOURCE_DIMENSION Dimension,
                                                                       Uint32             SampleCount) const
{
    UNSUPPORTED("GetSparseTextureFormatInfo is not supported in OpenGL");
    return {};
}